

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

bool __thiscall CoinsViewScanReserver::reserve(CoinsViewScanReserver *this)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  byte *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000018;
  char *in_stack_00000020;
  int in_stack_0000002c;
  char *in_stack_00000030;
  bool *in_stack_00000038;
  byte *pbVar4;
  undefined5 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff5;
  undefined1 in_stack_fffffffffffffff6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = (*in_RDI ^ 0xff) & 1;
  pbVar4 = in_RDI;
  inline_check_non_fatal<bool>
            (in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020,
             in_stack_00000018);
  bVar3 = std::atomic<bool>::exchange
                    ((atomic<bool> *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffff6,
                                             CONCAT15(in_stack_fffffffffffffff5,
                                                      in_stack_fffffffffffffff0))),
                     SUB81((ulong)pbVar4 >> 0x38,0),(memory_order)pbVar4);
  if (!bVar3) {
    std::__atomic_base::operator_cast_to_int
              ((__atomic_base<int> *)
               CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffff6,
                                       CONCAT15(in_stack_fffffffffffffff5,in_stack_fffffffffffffff0)
                                      )));
    inline_check_non_fatal<bool>
              (in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020,
               in_stack_00000018);
    *in_RDI = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return !bVar3;
}

Assistant:

bool reserve() {
        CHECK_NONFATAL(!m_could_reserve);
        if (g_scan_in_progress.exchange(true)) {
            return false;
        }
        CHECK_NONFATAL(g_scan_progress == 0);
        m_could_reserve = true;
        return true;
    }